

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmCTestGIT.cxx
# Opt level: O2

void __thiscall cmCTestGIT::CommitParser::NextSection(CommitParser *this)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *__s;
  cmCTestGIT *pcVar1;
  ulong uVar2;
  SectionType SVar3;
  Revision local_120;
  
  uVar2 = (long)(int)(this->Section + SectionBody) % 3;
  SVar3 = (SectionType)uVar2;
  this->Section = SVar3;
  (this->super_DiffParser).super_LineParser.Separator = "\n\n"[uVar2 & 0xffffffff];
  if (SVar3 != SectionHeader) {
    return;
  }
  pcVar1 = (this->super_DiffParser).GIT;
  (*(pcVar1->super_cmCTestGlobalVC).super_cmCTestVC._vptr_cmCTestVC[9])
            (pcVar1,&this->Rev,&(this->super_DiffParser).Changes);
  __s = &local_120.Rev.field_2;
  memset(__s,0,0xf0);
  local_120.Rev._M_string_length = 0;
  local_120.Date._M_dataplus._M_p = (pointer)&local_120.Date.field_2;
  local_120.Date.field_2._M_local_buf[0] = '\0';
  local_120.Author._M_dataplus._M_p = (pointer)&local_120.Author.field_2;
  local_120.Author.field_2._M_local_buf[0] = '\0';
  local_120.EMail._M_dataplus._M_p = (pointer)&local_120.EMail.field_2;
  local_120.EMail.field_2._M_local_buf[0] = '\0';
  local_120.Committer._M_dataplus._M_p = (pointer)&local_120.Committer.field_2;
  local_120.Committer.field_2._M_local_buf[0] = '\0';
  local_120.CommitterEMail._M_dataplus._M_p = (pointer)&local_120.CommitterEMail.field_2;
  local_120.CommitterEMail.field_2._M_local_buf[0] = '\0';
  local_120.CommitDate._M_dataplus._M_p = (pointer)&local_120.CommitDate.field_2;
  local_120.CommitDate.field_2._M_local_buf[0] = '\0';
  local_120.Log._M_dataplus._M_p = (pointer)&local_120.Log.field_2;
  local_120.Log.field_2._M_local_buf[0] = '\0';
  local_120.Rev._M_dataplus._M_p = (pointer)__s;
  cmCTestVC::Revision::operator=(&this->Rev,&local_120);
  cmCTestVC::Revision::~Revision(&local_120);
  DiffParser::DiffReset(&this->super_DiffParser);
  return;
}

Assistant:

void NextSection()
  {
    this->Section = SectionType((this->Section + 1) % SectionCount);
    this->Separator = SectionSep[this->Section];
    if (this->Section == SectionHeader) {
      this->GIT->DoRevision(this->Rev, this->Changes);
      this->Rev = Revision();
      this->DiffReset();
    }
  }